

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall Min2<0>::propagate(Min2<0> *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  IntVar *pIVar5;
  IntVar *pIVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  IntVar *pIVar10;
  long lVar11;
  
  pIVar6 = (this->x).var;
  pIVar10 = (this->z).var;
  iVar3 = (pIVar6->max).v;
  iVar2 = (pIVar10->max).v;
  if (iVar3 < iVar2) {
    if (so.lazy) {
      iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])(pIVar6);
      lVar11 = (long)iVar2 * 4 + 2;
      pIVar10 = (this->z).var;
    }
    else {
      lVar11 = 0;
    }
    iVar3 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar10,(long)iVar3,lVar11,1);
    if ((char)iVar3 != '\0') {
      pIVar10 = (this->z).var;
      iVar2 = (pIVar10->max).v;
      goto LAB_0018de82;
    }
LAB_0018e00d:
    bVar1 = false;
  }
  else {
LAB_0018de82:
    pIVar6 = (this->y).var;
    iVar3 = (pIVar6->max).v;
    if (iVar3 < iVar2) {
      if (so.lazy == true) {
        iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])(pIVar6);
        lVar11 = (long)iVar2 * 4 + 2;
        pIVar10 = (this->z).var;
      }
      else {
        lVar11 = 0;
      }
      iVar3 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar10,(long)iVar3,lVar11,1);
      if ((char)iVar3 == '\0') goto LAB_0018e00d;
      pIVar6 = (this->y).var;
      pIVar10 = (this->z).var;
    }
    pIVar5 = (this->x).var;
    iVar3 = (pIVar5->min).v;
    iVar2 = (pIVar6->min).v;
    if (iVar3 < iVar2) {
      iVar2 = iVar3;
    }
    iVar7 = (pIVar10->min).v;
    if (iVar7 < iVar2) {
      lVar11 = (long)iVar2;
      if (so.lazy == true) {
        iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xb])(pIVar5,lVar11);
        pIVar6 = (this->y).var;
        uVar4 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xb])(pIVar6,lVar11);
        uVar8 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar10 = (this->z).var;
      }
      else {
        uVar8 = 0;
      }
      iVar3 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])(pIVar10,lVar11,uVar8,1);
      if ((char)iVar3 == '\0') goto LAB_0018e00d;
      pIVar5 = (this->x).var;
      pIVar10 = (this->z).var;
      iVar7 = (pIVar10->min).v;
      iVar3 = (pIVar5->min).v;
    }
    lVar11 = (long)iVar7;
    if (iVar3 < iVar7) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[8])();
        lVar9 = (long)iVar3 * 4 + 2;
        pIVar5 = (this->x).var;
      }
      else {
        lVar9 = 0;
      }
      iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])(pIVar5,lVar11,lVar9,1);
      if ((char)iVar3 == '\0') goto LAB_0018e00d;
      pIVar10 = (this->z).var;
      iVar7 = (pIVar10->min).v;
      lVar11 = (long)iVar7;
    }
    pIVar6 = (this->y).var;
    if ((pIVar6->min).v < iVar7) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[8])();
        lVar9 = (long)iVar3 * 4 + 2;
        pIVar6 = (this->y).var;
      }
      else {
        lVar9 = 0;
      }
      iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])(pIVar6,lVar11,lVar9,1);
      if ((char)iVar3 == '\0') goto LAB_0018e00d;
      iVar7 = (((this->z).var)->min).v;
    }
    if ((iVar7 == (((this->x).var)->max).v) || (bVar1 = true, iVar7 == (((this->y).var)->max).v)) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(b_i))

		setDom(z, setMax, x.getMax(), x.getMaxLit());
		setDom(z, setMax, y.getMax(), y.getMaxLit());

		const int64_t m = (x.getMin() < y.getMin() ? x.getMin() : y.getMin());
		setDom(z, setMin, m, x.getFMinLit(m), y.getFMinLit(m));

		setDom(x, setMin, z.getMin(), z.getMinLit());
		setDom(y, setMin, z.getMin(), z.getMinLit());

		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}

		return true;
	}